

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

seconds32 __thiscall libtorrent::aux::torrent::active_time(torrent *this)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<int,_std::ratio<1L,_1L>_> local_1c;
  torrent *local_18;
  torrent *this_local;
  
  local_18 = this;
  bVar1 = is_paused(this);
  if (bVar1) {
    this_local._4_4_ = (this->m_active_time).__r;
  }
  else {
    local_30.__d.__r = (duration)time_now();
    local_28.__r = (rep)::std::chrono::operator-(&local_30,&this->m_started);
    local_1c.__r = (rep_conflict)
                   ::std::chrono::
                   duration_cast<std::chrono::duration<int,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                             (&local_28);
    this_local._4_4_ = ::std::chrono::operator+(&this->m_active_time,&local_1c);
  }
  return (seconds32)this_local._4_4_;
}

Assistant:

seconds32 torrent::active_time() const
	{
		if (is_paused())
			return m_active_time;

		// m_active_time does not account for the current "session", just the
		// time before we last started this torrent. To get the current time, we
		// need to add the time since we started it
		return m_active_time + duration_cast<seconds32>(
			aux::time_now() - m_started);
	}